

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

bool __thiscall
soul::ResolutionPass::ModuleInstanceResolver::validateSpecialisationParam
          (ModuleInstanceResolver *this,ASTObject *param,bool shouldIgnoreErrors)

{
  long *plVar1;
  char cVar2;
  long lVar3;
  long local_108;
  CompileMessage local_100;
  CompileMessage local_c8;
  CompileMessage local_90;
  CompileMessage local_58;
  
  lVar3 = __dynamic_cast(param,&AST::ASTObject::typeinfo,&AST::UsingDeclaration::typeinfo,0);
  if (lVar3 == 0) {
    lVar3 = __dynamic_cast(param,&AST::ASTObject::typeinfo,&AST::ProcessorAliasDeclaration::typeinfo
                           ,0);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(param,&AST::ASTObject::typeinfo,&AST::VariableDeclaration::typeinfo,0);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(param,&AST::ASTObject::typeinfo,
                               &AST::NamespaceAliasDeclaration::typeinfo,0);
        if (lVar3 == 0) {
          return false;
        }
        if (*(long **)(lVar3 + 0x30) != (long *)0x0) {
          (**(code **)(**(long **)(lVar3 + 0x30) + 0x38))(&local_108);
          *(long *)(lVar3 + 0x40) = local_108;
          if (shouldIgnoreErrors || local_108 != 0) {
            return local_108 != 0;
          }
          lVar3 = *(long *)(lVar3 + 0x30);
          if (lVar3 != 0) {
            CompileMessageHelpers::createMessage<>
                      (&local_100,syntax,error,"Expected a namespace name");
            AST::Context::throwError((Context *)(lVar3 + 0x10),&local_100,false);
          }
          goto LAB_002090a9;
        }
      }
      else {
        plVar1 = *(long **)(lVar3 + 0x38);
        if (plVar1 != (long *)0x0) {
          if ((int)plVar1[5] == 0) {
            cVar2 = (**(code **)(*plVar1 + 0x18))();
          }
          else {
            cVar2 = '\0';
          }
          if (shouldIgnoreErrors || cVar2 != '\0') {
            return (bool)cVar2;
          }
          lVar3 = *(long *)(lVar3 + 0x38);
          if (lVar3 != 0) {
            CompileMessageHelpers::createMessage<>(&local_c8,syntax,error,"Expected a value");
            AST::Context::throwError((Context *)(lVar3 + 0x10),&local_c8,false);
          }
LAB_002090a9:
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
      }
    }
    else if (*(long **)(lVar3 + 0x30) != (long *)0x0) {
      (**(code **)(**(long **)(lVar3 + 0x30) + 0x30))(&local_108);
      *(long *)(lVar3 + 0x38) = local_108;
      if (shouldIgnoreErrors || local_108 != 0) {
        return local_108 != 0;
      }
      lVar3 = *(long *)(lVar3 + 0x30);
      if (lVar3 != 0) {
        CompileMessageHelpers::createMessage<>(&local_90,syntax,error,"Expected a processor name");
        AST::Context::throwError((Context *)(lVar3 + 0x10),&local_90,false);
      }
      goto LAB_002090a9;
    }
  }
  else {
    plVar1 = *(long **)(lVar3 + 0x38);
    if (plVar1 != (long *)0x0) {
      if ((int)plVar1[5] == 1) {
        cVar2 = (**(code **)(*plVar1 + 0x18))();
      }
      else {
        cVar2 = '\0';
      }
      if (shouldIgnoreErrors || cVar2 != '\0') {
        return (bool)cVar2;
      }
      lVar3 = *(long *)(lVar3 + 0x38);
      if (lVar3 != 0) {
        CompileMessageHelpers::createMessage<>(&local_58,syntax,error,"Expected a type");
        AST::Context::throwError((Context *)(lVar3 + 0x10),&local_58,false);
      }
      goto LAB_002090a9;
    }
  }
  return true;
}

Assistant:

bool validateSpecialisationParam (AST::ASTObject& param, bool shouldIgnoreErrors) const
        {
            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                if (u->targetType == nullptr)
                    return true;

                if (AST::isResolvedAsType (*u->targetType))
                    return true;

                if (! shouldIgnoreErrors)
                    u->targetType->context.throwError (Errors::expectedType());

                return false;
            }
            else if (auto pa = cast<AST::ProcessorAliasDeclaration> (param))
            {
                if (pa->targetProcessor == nullptr)
                    return true;

                pa->resolvedProcessor = pa->targetProcessor->getAsProcessor();

                if (pa->resolvedProcessor != nullptr)
                    return true;

                if (! shouldIgnoreErrors)
                    pa->targetProcessor->context.throwError (Errors::expectedProcessorName());

                return false;
            }
            else if (auto v = cast<AST::VariableDeclaration> (param))
            {
                if (v->initialValue == nullptr)
                    return true;

                if (AST::isResolvedAsValue (*v->initialValue))
                    return true;

                if (! shouldIgnoreErrors)
                    v->initialValue->context.throwError (Errors::expectedValue());

                return false;
            }
            else if (auto n = cast<AST::NamespaceAliasDeclaration> (param))
            {
                if (n->targetNamespace == nullptr)
                    return true;

                n->resolvedNamespace = n->targetNamespace->getAsNamespace();

                if (n->resolvedNamespace != nullptr)
                    return true;

                if (! shouldIgnoreErrors)
                    n->targetNamespace->context.throwError (Errors::expectedNamespaceName());

                return false;
            }

            return false;
        }